

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O3

void __thiscall
CTestGen9Resource_Test1DTileYsResourceMips_Test::TestBody
          (CTestGen9Resource_Test1DTileYsResourceMips_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  undefined1 auVar1 [16];
  CTestGen9Resource_Test1DTileYsResourceMips_Test *this_01;
  bool bVar2;
  GMM_RESOURCE_INFO *ResourceInfo;
  ulong uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint *expected;
  ulong uVar11;
  uint uVar12;
  undefined4 uVar15;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  long lVar23;
  undefined1 in_XMM8 [16];
  long lVar24;
  undefined1 in_XMM9 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 in_XMM13 [16];
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0 [16];
  undefined8 local_190;
  ulong uStack_188;
  undefined1 local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined5 local_150;
  undefined1 auStack_14b [11];
  undefined8 local_140;
  ulong local_138;
  CTestGen9Resource_Test1DTileYsResourceMips_Test *local_130;
  undefined1 auStack_128 [8];
  GMM_REQ_OFFSET_INFO OffsetInfo;
  undefined8 uStack_b8;
  uint32_t MipTailOffsets [15];
  uint local_64;
  GMM_RESOURCE_INFO *pGStack_60;
  uint32_t MipTailStart;
  AssertHelper local_58;
  uint local_4c;
  undefined4 uStack_48;
  uint32_t StartOfMip;
  AssertionResult gtest_ar_5;
  ulong uVar28;
  
  local_160 = (undefined1  [16])0x0;
  local_170 = (undefined1  [16])0x0;
  local_190 = 0;
  local_1a0 = (undefined1  [16])0x0;
  local_140 = 0;
  local_1b8 = 1;
  auStack_14b = SUB1611((undefined1  [16])0x0,5);
  local_150 = 0x100000000;
  local_1a8 = 0x4000000000;
  local_1b0 = 0x400000000;
  local_180._0_12_ = ZEXT412(5) << 0x40;
  local_180._12_4_ = 0;
  uVar11 = 0;
  this_00 = &gtest_ar_5.message_;
  local_130 = this;
  do {
    local_1b4 = (&DAT_001a7f2c)[(int)uVar11];
    uStack_188 = 0x4000;
    local_180._0_4_ = 1;
    ResourceInfo = (GMM_RESOURCE_INFO *)
                   (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                             (CommonULT::pGmmULTClientContext,&local_1b8);
    this_01 = local_130;
    local_64 = local_180._8_4_;
    uVar10 = 0;
    do {
      uVar9 = (uint)uVar10;
      if (uStack_188 >> ((byte)uVar10 & 0x3f) <= (ulong)(uint)(&DAT_001a71f0)[uVar11]) break;
      uVar8 = (uint)uVar10 + 1;
      uVar10 = (ulong)uVar8;
      uVar9 = local_64;
    } while (uVar8 <= (uint)local_180._8_4_);
    local_64 = uVar9;
    uVar9 = (&DAT_001a71d0)[uVar11] - 1;
    OffsetInfo.StdLayout.TileDepthPitch = (GMM_GFX_SIZE_T)uVar9;
    uVar6 = ~OffsetInfo.StdLayout.TileDepthPitch;
    uVar8 = (uint)uVar10;
    uVar3 = (ulong)(uVar8 + 1) + 3 & 0xfffffffffffffffc;
    lVar5 = (ulong)(uVar8 + 1) - 1;
    auVar14._8_4_ = (int)lVar5;
    auVar14._0_8_ = lVar5;
    auVar14._12_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar22._8_4_ = (int)uStack_188;
    auVar22._0_8_ = uStack_188;
    auVar22._12_4_ = (int)(uStack_188 >> 0x20);
    uVar12 = (uint)uVar6;
    uVar15 = (undefined4)(uVar6 >> 0x20);
    in_XMM8 = pmovsxbq(in_XMM8,0x100);
    in_XMM9 = pmovsxbq(in_XMM9,0x302);
    in_XMM13 = pmovsxbq(in_XMM13,0x404);
    auVar18 = (undefined1  [16])0x0;
    do {
      auVar25 = in_XMM9;
      auVar21 = in_XMM8;
      auVar16 = auVar18;
      lVar23 = auVar21._0_8_;
      uVar28 = auVar22._8_8_;
      auVar26._0_8_ = uStack_188 >> lVar23;
      auVar26._8_8_ = uVar28 >> lVar23;
      lVar5 = auVar21._8_8_;
      auVar17._0_8_ = uStack_188 >> lVar5;
      auVar17._8_8_ = uVar28 >> lVar5;
      auVar18 = pblendw(auVar17,auVar26,0xf);
      lVar24 = auVar25._0_8_;
      auVar27._0_8_ = uStack_188 >> lVar24;
      auVar27._8_8_ = uVar28 >> lVar24;
      lVar20 = auVar25._8_8_;
      auVar29._0_8_ = uStack_188 >> lVar20;
      auVar29._8_8_ = uVar28 >> lVar20;
      auVar30 = pblendw(auVar29,auVar27,0xf);
      auVar31._0_8_ = auVar30._0_8_ + (ulong)uVar9;
      auVar31._8_8_ = auVar30._8_8_ + (ulong)uVar9;
      auVar19._0_8_ = auVar18._0_8_ + (ulong)uVar9;
      auVar19._8_8_ = auVar18._8_8_ + (ulong)uVar9;
      auVar30._8_4_ = uVar12;
      auVar30._0_8_ = uVar6;
      auVar30._12_4_ = uVar15;
      auVar1._8_4_ = uVar12;
      auVar1._0_8_ = uVar6;
      auVar1._12_4_ = uVar15;
      auVar18._0_4_ = SUB164(auVar19 & auVar30,0) + auVar16._0_4_;
      auVar18._4_4_ = SUB164(auVar19 & auVar30,8) + auVar16._4_4_;
      auVar18._8_4_ = SUB164(auVar31 & auVar1,0) + auVar16._8_4_;
      auVar18._12_4_ = SUB164(auVar31 & auVar1,8) + auVar16._12_4_;
      in_XMM8._0_8_ = lVar23 + in_XMM13._0_8_;
      in_XMM8._8_8_ = lVar5 + in_XMM13._8_8_;
      in_XMM9._0_8_ = lVar24 + in_XMM13._0_8_;
      in_XMM9._8_8_ = lVar20 + in_XMM13._8_8_;
      uVar3 = uVar3 - 4;
    } while (uVar3 != 0);
    lVar5 = SUB168(auVar14 ^ _DAT_001a57f0,0);
    auVar13._0_8_ = -(ulong)(lVar5 < SUB168(auVar21 ^ _DAT_001a57f0,0));
    lVar20 = SUB168(auVar14 ^ _DAT_001a57f0,8);
    auVar13._8_8_ = -(ulong)(lVar20 < SUB168(auVar21 ^ _DAT_001a57f0,8));
    auVar21._0_8_ = -(ulong)(lVar5 < SUB168(auVar25 ^ _DAT_001a57f0,0));
    auVar21._8_8_ = -(ulong)(lVar20 < SUB168(auVar25 ^ _DAT_001a57f0,8));
    auVar14 = packssdw(auVar13,auVar21);
    auVar18 = blendvps(auVar18,auVar16,auVar14);
    iVar4 = 0;
    if (uVar11 < 5) {
      iVar4 = (&DAT_001a7f18)[uVar11];
    }
    auVar18 = phaddd(auVar18,auVar18);
    auVar18 = phaddd(auVar18,auVar18);
    pGStack_60 = ResourceInfo;
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)local_130,ResourceInfo,(&DAT_001a71d0)[uVar11]);
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)this_01,ResourceInfo,
               (ulong)(auVar18._0_4_ * iVar4 + 0xfffU & 0xfffff000));
    local_4c = 0;
    if (uVar8 != 0) {
      uVar3 = 0;
      local_138 = uVar10;
      do {
        OffsetInfo.StdLayout.Offset = 0;
        OffsetInfo.StdLayout.TileRowPitch = 0;
        OffsetInfo.Render.XOffset = 0;
        OffsetInfo.Render.YOffset = 0;
        OffsetInfo.Render.ZOffset = 0;
        OffsetInfo.Render._20_4_ = 0;
        OffsetInfo.Lock.Pitch = 0;
        OffsetInfo.Lock.field_2 =
             (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
        OffsetInfo.Render.field_0 =
             (anon_union_8_2_48ff183f_for_anon_struct_24_4_8d4e87d8_for_Render_0)0x0;
        OffsetInfo.Frame = GMM_DISPLAY_BASE;
        OffsetInfo._28_4_ = 0;
        OffsetInfo.Lock.field_0 =
             (anon_union_8_2_48ff183f_for_anon_struct_16_3_bc420dd9_for_Lock_0)0x0;
        OffsetInfo.MipLevel = 0;
        OffsetInfo.Slice = 0;
        OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
        OffsetInfo.Plane = GMM_NO_PLANE;
        stack0xfffffffffffffedc = SUB1612((undefined1  [16])0x0,4);
        auStack_128._0_4_ = 1;
        OffsetInfo._0_4_ = (int)uVar3;
        OffsetInfo.ArrayIndex = 0;
        (**(code **)(*(long *)pGStack_60 + 0x68))(pGStack_60,auStack_128);
        if (uVar3 == 0) {
          iVar4 = 0;
        }
        else {
          iVar4 = 0;
          if (uVar11 < 5) {
            iVar4 = (&DAT_001a7f18)[uVar11];
          }
          iVar4 = ((int)(uStack_188 >> ((char)uVar3 - 1U & 0x3f)) +
                   (int)OffsetInfo.StdLayout.TileDepthPitch & uVar12) * iVar4;
        }
        local_4c = local_4c + iVar4;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  ((internal *)&uStack_b8,"StartOfMip","OffsetInfo.Render.Offset64",&local_4c,
                   (unsigned_long *)&OffsetInfo.Lock.Pitch);
        if (uStack_b8._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&uStack_48);
          pcVar7 = "";
          if (MipTailOffsets._0_8_ != 0) {
            pcVar7 = *(char **)MipTailOffsets._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_00,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                     ,0x199,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)&uStack_48);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
          if (((CONCAT44(StartOfMip,uStack_48) != 0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             ((long *)CONCAT44(StartOfMip,uStack_48) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(StartOfMip,uStack_48) + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)MipTailOffsets,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        uStack_48 = 0;
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)&uStack_b8,"0","OffsetInfo.Render.XOffset",(int *)&uStack_48,
                   (uint *)&OffsetInfo.Render);
        if (uStack_b8._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&uStack_48);
          pcVar7 = "";
          if (MipTailOffsets._0_8_ != 0) {
            pcVar7 = *(char **)MipTailOffsets._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_00,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                     ,0x19a,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)&uStack_48);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
          if (((CONCAT44(StartOfMip,uStack_48) != 0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             ((long *)CONCAT44(StartOfMip,uStack_48) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(StartOfMip,uStack_48) + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)MipTailOffsets,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        uStack_48 = 0;
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)&uStack_b8,"0","OffsetInfo.Render.YOffset",(int *)&uStack_48,
                   (uint *)((long)&OffsetInfo.Render.field_0 + 4));
        if (uStack_b8._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&uStack_48);
          pcVar7 = "";
          if (MipTailOffsets._0_8_ != 0) {
            pcVar7 = *(char **)MipTailOffsets._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_00,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                     ,0x19b,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)&uStack_48);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
          if (((CONCAT44(StartOfMip,uStack_48) != 0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             ((long *)CONCAT44(StartOfMip,uStack_48) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(StartOfMip,uStack_48) + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)MipTailOffsets,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        uStack_48 = 0;
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)&uStack_b8,"0","OffsetInfo.Render.ZOffset",(int *)&uStack_48,
                   &OffsetInfo.Render.XOffset);
        if (uStack_b8._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&uStack_48);
          pcVar7 = "";
          if (MipTailOffsets._0_8_ != 0) {
            pcVar7 = *(char **)MipTailOffsets._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_00,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                     ,0x19c,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)&uStack_48);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
          if (((CONCAT44(StartOfMip,uStack_48) != 0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             ((long *)CONCAT44(StartOfMip,uStack_48) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(StartOfMip,uStack_48) + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)MipTailOffsets,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        uVar3 = uVar3 + 1;
      } while (local_138 != uVar3);
    }
    MipTailOffsets[10] = 0xc0;
    MipTailOffsets[0xb] = 0x80;
    MipTailOffsets[0xc] = 0x40;
    MipTailOffsets[6] = 0x1c0;
    MipTailOffsets[7] = 0x180;
    MipTailOffsets[8] = 0x140;
    MipTailOffsets[9] = 0x100;
    MipTailOffsets[2] = 0x800;
    MipTailOffsets[3] = 0x400;
    MipTailOffsets[4] = 0x300;
    MipTailOffsets[5] = 0x200;
    uStack_b8 = 0x400000008000;
    MipTailOffsets[0] = 0x2000;
    MipTailOffsets[1] = 0x1000;
    uStack_48 = (**(code **)(*(long *)pGStack_60 + 0x90))();
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)auStack_128,"MipTailStart","ResourceInfo->GetPackedMipTailStartLod()",
               &local_64,(uint *)&uStack_48);
    if (auStack_128[0] == (internal)0x0) {
      testing::Message::Message((Message *)&uStack_48);
      pcVar7 = "";
      if (OffsetInfo._0_8_ != 0) {
        pcVar7 = *(char **)OffsetInfo._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x1a1,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)&uStack_48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      if (((CONCAT44(StartOfMip,uStack_48) != 0) && (bVar2 = testing::internal::IsTrue(true), bVar2)
          ) && ((long *)CONCAT44(StartOfMip,uStack_48) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(StartOfMip,uStack_48) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&OffsetInfo,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    iVar4 = 0;
    if (uVar11 < 5) {
      iVar4 = (&DAT_001a7f18)[uVar11];
    }
    local_4c = local_4c +
               ((int)(uStack_188 >> ((char)uVar10 - 1U & 0x3f)) +
                (int)OffsetInfo.StdLayout.TileDepthPitch & uVar12) * iVar4;
    if (uVar8 <= (uint)local_180._8_4_) {
      expected = (uint *)&uStack_b8;
      do {
        OffsetInfo.StdLayout.Offset = 0;
        OffsetInfo.StdLayout.TileRowPitch = 0;
        OffsetInfo.Render.XOffset = 0;
        OffsetInfo.Render.YOffset = 0;
        OffsetInfo.Render.ZOffset = 0;
        OffsetInfo.Render._20_4_ = 0;
        OffsetInfo.Lock.Pitch = 0;
        OffsetInfo.Lock.field_2 =
             (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
        OffsetInfo.Render.field_0 =
             (anon_union_8_2_48ff183f_for_anon_struct_24_4_8d4e87d8_for_Render_0)0x0;
        OffsetInfo.Frame = GMM_DISPLAY_BASE;
        OffsetInfo._28_4_ = 0;
        OffsetInfo.Lock.field_0 =
             (anon_union_8_2_48ff183f_for_anon_struct_16_3_bc420dd9_for_Lock_0)0x0;
        OffsetInfo.MipLevel = 0;
        OffsetInfo.Slice = 0;
        OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
        OffsetInfo.Plane = GMM_NO_PLANE;
        stack0xfffffffffffffedc = SUB1612((undefined1  [16])0x0,4);
        auStack_128._0_4_ = 1;
        uVar9 = (uint)uVar10;
        OffsetInfo._0_4_ = uVar9;
        OffsetInfo.ArrayIndex = 0;
        (**(code **)(*(long *)pGStack_60 + 0x68))(pGStack_60,auStack_128);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  ((internal *)&uStack_48,"StartOfMip","OffsetInfo.Render.Offset64",&local_4c,
                   (unsigned_long *)&OffsetInfo.Lock.Pitch);
        if (uStack_48._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)this_00);
          pcVar7 = "";
          if (gtest_ar_5._0_8_ != 0) {
            pcVar7 = *(char **)gtest_ar_5._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                     ,0x1a9,pcVar7);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)this_00);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          if (((CONCAT44(gtest_ar_5.message_.ptr_._4_4_,gtest_ar_5.message_.ptr_._0_4_) != 0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             ((long *)CONCAT44(gtest_ar_5.message_.ptr_._4_4_,gtest_ar_5.message_.ptr_._0_4_) !=
              (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(gtest_ar_5.message_.ptr_._4_4_,
                                           gtest_ar_5.message_.ptr_._0_4_) + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_5,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&uStack_48,"MipTailOffsets[slot]","OffsetInfo.Render.XOffset",
                   expected,(uint *)&OffsetInfo.Render);
        if (uStack_48._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)this_00);
          pcVar7 = "";
          if (gtest_ar_5._0_8_ != 0) {
            pcVar7 = *(char **)gtest_ar_5._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                     ,0x1aa,pcVar7);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)this_00);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          if (((CONCAT44(gtest_ar_5.message_.ptr_._4_4_,gtest_ar_5.message_.ptr_._0_4_) != 0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             ((long *)CONCAT44(gtest_ar_5.message_.ptr_._4_4_,gtest_ar_5.message_.ptr_._0_4_) !=
              (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(gtest_ar_5.message_.ptr_._4_4_,
                                           gtest_ar_5.message_.ptr_._0_4_) + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_5,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        gtest_ar_5.message_.ptr_._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)&uStack_48,"0","OffsetInfo.Render.YOffset",(int *)this_00,
                   (uint *)((long)&OffsetInfo.Render.field_0 + 4));
        if (uStack_48._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)this_00);
          pcVar7 = "";
          if (gtest_ar_5._0_8_ != 0) {
            pcVar7 = *(char **)gtest_ar_5._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                     ,0x1ab,pcVar7);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)this_00);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          if (((CONCAT44(gtest_ar_5.message_.ptr_._4_4_,gtest_ar_5.message_.ptr_._0_4_) != 0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             ((long *)CONCAT44(gtest_ar_5.message_.ptr_._4_4_,gtest_ar_5.message_.ptr_._0_4_) !=
              (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(gtest_ar_5.message_.ptr_._4_4_,
                                           gtest_ar_5.message_.ptr_._0_4_) + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_5,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        gtest_ar_5.message_.ptr_._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)&uStack_48,"0","OffsetInfo.Render.ZOffset",(int *)this_00,
                   &OffsetInfo.Render.XOffset);
        if (uStack_48._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)this_00);
          pcVar7 = "";
          if (gtest_ar_5._0_8_ != 0) {
            pcVar7 = *(char **)gtest_ar_5._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                     ,0x1ac,pcVar7);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)this_00);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          if (((CONCAT44(gtest_ar_5.message_.ptr_._4_4_,gtest_ar_5.message_.ptr_._0_4_) != 0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             ((long *)CONCAT44(gtest_ar_5.message_.ptr_._4_4_,gtest_ar_5.message_.ptr_._0_4_) !=
              (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(gtest_ar_5.message_.ptr_._4_4_,
                                           gtest_ar_5.message_.ptr_._0_4_) + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_5,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        expected = expected + 1;
        uVar10 = (ulong)(uVar9 + 1);
      } while (uVar9 < (uint)local_180._8_4_);
    }
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGStack_60);
    uVar11 = uVar11 + 1;
    if (uVar11 == 5) {
      return;
    }
  } while( true );
}

Assistant:

TEST_F(CTestGen9Resource, Test1DTileYsResourceMips)
{
    const uint32_t TileSize[TEST_BPP_MAX] = {65536, 32768, 16384, 8192, 4096};
    const uint32_t Mts[TEST_BPP_MAX]      = {32768, 16384, 8192, 4096, 2048};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_1D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledYs   = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    gmmParams.MaxLod               = 5;

    // Allocate all mips in 1 tile or multiple tiles, depending on the bpp
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 16 * 1024; // 16K is the max width you can specify
        gmmParams.BaseHeight  = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint32_t MaxMip;
        uint32_t MipTailStart = gmmParams.MaxLod;
        for(MaxMip = 0; MaxMip <= gmmParams.MaxLod; MaxMip++)
        {
            if((gmmParams.BaseWidth64 >> MaxMip) <= Mts[i])
            {
                MipTailStart = MaxMip;
                break;
            }
        }

        uint32_t AlignedWidth = 0;
        for(int mip = 0; mip <= MaxMip; mip++)
        {
            // Since 1D doesn't have a height, mips are just based on width
            AlignedWidth += GMM_ULT_ALIGN(gmmParams.BaseWidth64 >> mip, TileSize[i]);
            ;
        }

        uint32_t PitchInBytes = AlignedWidth * GetBppValue(bpp);
        uint32_t AlignedSize  = GMM_ULT_ALIGN(PitchInBytes, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, TileSize[i]);
        VerifyResourceVAlign<false>(ResourceInfo, 0);       // N/A for 1D
        VerifyResourcePitch<false>(ResourceInfo, 0);        // N/A for 1D
        VerifyResourcePitchInTiles<false>(ResourceInfo, 0); // N/A for linear
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);
        VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for non-arrayed

        // All mips should be right after one another linearly, until the miptail
        uint32_t StartOfMip = 0;
        int      mip;
        for(mip = 0; mip < MaxMip; mip++)
        {
            GMM_REQ_OFFSET_INFO OffsetInfo = {};
            OffsetInfo.ReqRender           = 1;
            OffsetInfo.MipLevel            = mip;
            ResourceInfo->GetOffset(OffsetInfo);
            StartOfMip += (mip == 0 ? 0 : GMM_ULT_ALIGN(gmmParams.BaseWidth64 >> (mip - 1), TileSize[i]) * GetBppValue(bpp));
            EXPECT_EQ(StartOfMip, OffsetInfo.Render.Offset64);
            EXPECT_EQ(0, OffsetInfo.Render.XOffset);
            EXPECT_EQ(0, OffsetInfo.Render.YOffset);
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset);
        }

        uint32_t MipTailOffsets[GMM_ULT_MAX_MIPMAP] = {32768, 16384, 8192, 4096, 2048, 1024, 768, 512, 448, 384, 320, 256, 192, 128, 64};
        // Check for offset inside miptails.
        EXPECT_EQ(MipTailStart, ResourceInfo->GetPackedMipTailStartLod());
        StartOfMip += GMM_ULT_ALIGN(gmmParams.BaseWidth64 >> (mip - 1), TileSize[i]) * GetBppValue(bpp); // Start of MipTail
        for(int slot = 0; mip <= gmmParams.MaxLod; mip++, slot++)
        {
            GMM_REQ_OFFSET_INFO OffsetInfo = {};
            OffsetInfo.ReqRender           = 1;
            OffsetInfo.MipLevel            = mip;
            ResourceInfo->GetOffset(OffsetInfo);
            EXPECT_EQ(StartOfMip, OffsetInfo.Render.Offset64);          // Start of Miptail
            EXPECT_EQ(MipTailOffsets[slot], OffsetInfo.Render.XOffset); // Offset within miptail
            EXPECT_EQ(0, OffsetInfo.Render.YOffset);
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset);
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}